

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O1

void __thiscall
testing::internal::
ElementsAreMatcherImpl<std::vector<prometheus::ClientMetric::Label,std::allocator<prometheus::ClientMetric::Label>>const&>
::
ElementsAreMatcherImpl<__gnu_cxx::__normal_iterator<testing::Matcher<prometheus::ClientMetric::Label_const&>*,std::vector<testing::Matcher<prometheus::ClientMetric::Label_const&>,std::allocator<testing::Matcher<prometheus::ClientMetric::Label_const&>>>>>
          (ElementsAreMatcherImpl<std::vector<prometheus::ClientMetric::Label,std::allocator<prometheus::ClientMetric::Label>>const&>
           *this,__normal_iterator<testing::Matcher<const_prometheus::ClientMetric::Label_&>_*,_std::vector<testing::Matcher<const_prometheus::ClientMetric::Label_&>,_std::allocator<testing::Matcher<const_prometheus::ClientMetric::Label_&>_>_>_>
                 first,
          __normal_iterator<testing::Matcher<const_prometheus::ClientMetric::Label_&>_*,_std::vector<testing::Matcher<const_prometheus::ClientMetric::Label_&>,_std::allocator<testing::Matcher<const_prometheus::ClientMetric::Label_&>_>_>_>
          last)

{
  MatcherBase<const_prometheus::ClientMetric::Label_&> local_48;
  
  *(undefined ***)this = &PTR__ElementsAreMatcherImpl_001b2450;
  *(undefined8 *)(this + 8) = 0;
  *(undefined8 *)(this + 0x10) = 0;
  *(undefined8 *)(this + 0x18) = 0;
  if (first._M_current != last._M_current) {
    do {
      local_48.vtable_ =
           ((first._M_current)->super_MatcherBase<const_prometheus::ClientMetric::Label_&>).vtable_;
      local_48.buffer_ =
           (Buffer)((first._M_current)->super_MatcherBase<const_prometheus::ClientMetric::Label_&>).
                   buffer_.shared;
      if ((local_48.vtable_ != (VTable *)0x0) &&
         ((local_48.vtable_)->shared_destroy != (_func_void_SharedPayloadBase_ptr *)0x0)) {
        LOCK();
        ((local_48.buffer_.shared)->ref).super___atomic_base<int>._M_i =
             ((local_48.buffer_.shared)->ref).super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      local_48.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
           (_func_int **)&PTR__MatcherBase_001b05c0;
      std::
      vector<testing::Matcher<prometheus::ClientMetric::Label_const&>,std::allocator<testing::Matcher<prometheus::ClientMetric::Label_const&>>>
      ::emplace_back<testing::Matcher<prometheus::ClientMetric::Label_const&>>
                ((vector<testing::Matcher<prometheus::ClientMetric::Label_const&>,std::allocator<testing::Matcher<prometheus::ClientMetric::Label_const&>>>
                  *)(this + 8),(Matcher<const_prometheus::ClientMetric::Label_&> *)&local_48);
      first._M_current = first._M_current + 1;
      MatcherBase<const_prometheus::ClientMetric::Label_&>::~MatcherBase(&local_48);
    } while (first._M_current != last._M_current);
  }
  return;
}

Assistant:

ElementsAreMatcherImpl(InputIter first, InputIter last) {
    while (first != last) {
      matchers_.push_back(MatcherCast<const Element&>(*first++));
    }
  }